

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O3

bool __thiscall OSSLEVPMacAlgorithm::signFinal(OSSLEVPMacAlgorithm *this,ByteString *signature)

{
  HMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *md;
  uint outLen;
  uint local_2c;
  
  bVar1 = MacAlgorithm::signFinal(&this->super_MacAlgorithm,signature);
  if (bVar1) {
    iVar2 = (*(this->super_MacAlgorithm)._vptr_MacAlgorithm[0xc])(this);
    iVar2 = EVP_MD_get_size(iVar2);
    ByteString::resize(signature,(long)iVar2);
    sVar3 = ByteString::size(signature);
    local_2c = (uint)sVar3;
    ctx = (HMAC_CTX *)this->curCTX;
    md = ByteString::operator[](signature,0);
    iVar2 = HMAC_Final(ctx,md,&local_2c);
    bVar1 = iVar2 != 0;
    if (iVar2 == 0) {
      softHSMLog(3,"signFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
                 ,0x76,"HMAC_Final failed");
    }
    else {
      ByteString::resize(signature,(ulong)local_2c);
    }
    HMAC_CTX_free(this->curCTX);
    this->curCTX = (HMAC_CTX *)0x0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OSSLEVPMacAlgorithm::signFinal(ByteString& signature)
{
	if (!MacAlgorithm::signFinal(signature))
	{
		return false;
	}

	signature.resize(EVP_MD_size(getEVPHash()));
	unsigned int outLen = signature.size();

	if (!HMAC_Final(curCTX, &signature[0], &outLen))
	{
		ERROR_MSG("HMAC_Final failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	signature.resize(outLen);

	HMAC_CTX_free(curCTX);
	curCTX = NULL;

	return true;
}